

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzz_issue_tests.cpp
# Opt level: O0

int slowProblems_slowFiles_Test::AddToRegistry(void)

{
  UnitTest *this;
  ParameterizedTestSuiteRegistry *this_00;
  ParameterizedTestSuiteInfo<slowProblems> *this_01;
  TestMetaFactoryBase<int> *meta_factory;
  allocator local_d9;
  string local_d8;
  CodeLocation local_b8;
  allocator local_89;
  string local_88;
  CodeLocation local_68;
  allocator local_29;
  string local_28;
  
  this = testing::UnitTest::GetInstance();
  this_00 = testing::UnitTest::parameterized_test_registry(this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_28,"slowProblems",&local_29);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_88,
             "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/fuzz_issue_tests.cpp"
             ,&local_89);
  testing::internal::CodeLocation::CodeLocation(&local_68,&local_88,0x62);
  this_01 = testing::internal::ParameterizedTestSuiteRegistry::
            GetTestSuitePatternHolder<slowProblems>(this_00,&local_28,&local_68);
  meta_factory = (TestMetaFactoryBase<int> *)operator_new(8);
  meta_factory->_vptr_TestMetaFactoryBase = (_func_int **)0x0;
  testing::internal::TestMetaFactory<slowProblems_slowFiles_Test>::TestMetaFactory
            ((TestMetaFactory<slowProblems_slowFiles_Test> *)meta_factory);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_d8,
             "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/fuzz_issue_tests.cpp"
             ,&local_d9);
  testing::internal::CodeLocation::CodeLocation(&local_b8,&local_d8,0x62);
  testing::internal::ParameterizedTestSuiteInfo<slowProblems>::AddTestPattern
            (this_01,"slowProblems","slowFiles",meta_factory,&local_b8);
  testing::internal::CodeLocation::~CodeLocation(&local_b8);
  std::__cxx11::string::~string((string *)&local_d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_d9);
  testing::internal::CodeLocation::~CodeLocation(&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::allocator<char>::~allocator((allocator<char> *)&local_89);
  std::__cxx11::string::~string((string *)&local_28);
  std::allocator<char>::~allocator((allocator<char> *)&local_29);
  return 0;
}

Assistant:

TEST_P(slowProblems, slowFiles)
{
    auto cdata = loadFailureFile("slow", GetParam());
    ASSERT_FALSE(cdata.empty());
    EXPECT_NO_THROW(unit_from_string(cdata));
}